

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_wait_children_dep.cpp
# Opt level: O2

void g(int *i)

{
  long lVar1;
  ostream *poVar2;
  
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"g begin: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  *i = *i + 1;
  spin_mutex_t::lock(&my_io_mutex);
  std::operator<<((ostream *)&std::cerr,"g finish: ");
  lVar1 = std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<double>((double)(lVar1 - (long)t0.__d.__r) / 1000000000.0);
  poVar2 = std::operator<<(poVar2," with i=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*i);
  std::endl<char,std::char_traits<char>>(poVar2);
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void g(int &i) {  
  LOG("g begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  
  i++;
  
  LOG("g finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}